

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void __thiscall wasm::Debug::AddrExprMap::AddrExprMap(AddrExprMap *this,Module *wasm)

{
  Span span_00;
  bool bVar1;
  reference this_00;
  pointer pFVar2;
  reference __in;
  type *ppEVar3;
  type *ptVar4;
  reference __in_00;
  type *ppEVar5;
  type *delimiter;
  type *delim;
  type *expr_1;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
  local_98;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
  *__range3_1;
  type *span;
  type *expr;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
  local_50;
  iterator __end3;
  iterator __begin3;
  unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
  *__range3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Module *wasm_local;
  AddrExprMap *this_local;
  
  std::
  unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
  ::unordered_map(&this->startMap);
  std::
  unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
  ::unordered_map(&this->endMap);
  std::
  unordered_map<unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>_>
  ::unordered_map(&this->delimiterMap);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&wasm->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&wasm->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end2);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_00);
    __end3 = std::
             unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
             ::begin(&pFVar2->expressionLocations);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
         ::end(&pFVar2->expressionLocations);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
                         ,&local_50);
      if (!bVar1) break;
      __in = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
             ::operator*(&__end3);
      ppEVar3 = std::get<0ul,wasm::Expression*const,wasm::BinaryLocations::Span>(__in);
      ptVar4 = std::get<1ul,wasm::Expression*const,wasm::BinaryLocations::Span>(__in);
      span_00.start = ptVar4->start;
      span_00.end = ptVar4->end;
      add(this,*ppEVar3,span_00);
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
      ::operator++(&__end3);
    }
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_00);
    __end3_1 = std::
               unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
               ::begin(&pFVar2->delimiterLocations);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
         ::end(&pFVar2->delimiterLocations);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3_1.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                         ,&local_98);
      if (!bVar1) break;
      __in_00 = std::__detail::
                _Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
                ::operator*(&__end3_1);
      ppEVar5 = std::get<0ul,wasm::Expression*const,wasm::ZeroInitSmallVector<unsigned_int,1ul>>
                          (__in_00);
      delimiter = std::get<1ul,wasm::Expression*const,wasm::ZeroInitSmallVector<unsigned_int,1ul>>
                            (__in_00);
      add(this,*ppEVar5,delimiter);
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
      ::operator++(&__end3_1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

AddrExprMap(const Module& wasm) {
    for (auto& func : wasm.functions) {
      for (auto& [expr, span] : func->expressionLocations) {
        add(expr, span);
      }
      for (auto& [expr, delim] : func->delimiterLocations) {
        add(expr, delim);
      }
    }
  }